

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O2

void __thiscall CVmObjTable::save(CVmObjTable *this,CVmFile *fp)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  size_t sVar5;
  CVmObjPageEntry **ppCVar6;
  uint uVar7;
  uint v;
  CVmObjPageEntry *pCVar8;
  long lVar9;
  bool bVar10;
  char buf [2];
  
  gc_full(this);
  add_metadeps_for_instances(this);
  CVmMetaTable::write_to_file(G_meta_table_X,fp);
  gc_trace_imports(this);
  gc_trace_globals(this);
  iVar3 = 0;
  gc_trace_work_queue(this,0);
  lVar4 = CVmFile::get_pos(fp);
  CVmFile::write_uint4(fp,0);
  ppCVar6 = this->pages_;
  sVar5 = this->pages_used_;
  v = 0;
  uVar7 = 0;
  while (bVar10 = sVar5 != 0, sVar5 = sVar5 - 1, bVar10) {
    pCVar8 = *ppCVar6;
    for (lVar9 = 0; lVar9 != 0x1000; lVar9 = lVar9 + 1) {
      uVar1 = *(ushort *)&pCVar8->field_0x14;
      if ((uVar1 & 0xf) == 8) {
        CVmFile::write_uint4(fp,iVar3 + (int)lVar9);
        CVmFile::write_uint4(fp,uVar1 >> 7 & 1);
        v = v + 1;
      }
      iVar2 = CVmObjPageEntry::is_saveable(pCVar8);
      uVar7 = (uVar7 + 1) - (uint)(iVar2 == 0);
      pCVar8 = pCVar8 + 1;
    }
    ppCVar6 = ppCVar6 + 1;
    iVar3 = iVar3 + 0x1000;
  }
  lVar9 = CVmFile::get_pos(fp);
  CVmFile::set_pos(fp,lVar4);
  CVmFile::write_uint4(fp,v);
  CVmFile::set_pos(fp,lVar9);
  CVmFile::write_uint4(fp,uVar7);
  ppCVar6 = this->pages_;
  sVar5 = this->pages_used_;
  iVar3 = 0;
  while (bVar10 = sVar5 != 0, sVar5 = sVar5 - 1, bVar10) {
    pCVar8 = *ppCVar6;
    for (lVar4 = 0; lVar4 != 0x1000; lVar4 = lVar4 + 1) {
      uVar7 = iVar3 + (int)lVar4;
      iVar2 = CVmObjPageEntry::is_saveable(pCVar8);
      if (iVar2 != 0) {
        CVmFile::write_uint4(fp,uVar7);
        buf[0] = (byte)pCVar8->field_0x14 >> 1 & 1;
        lVar9 = (*(code *)**(undefined8 **)&pCVar8->ptr_)(pCVar8);
        buf[1] = (char)G_meta_table_X->reverse_map_[*(uint *)(lVar9 + 8)];
        CVmFile::write_bytes(fp,buf,2);
        (**(code **)(*(long *)&pCVar8->ptr_ + 0xe8))(pCVar8,fp);
      }
      gc_set_init_conditions(this,uVar7,pCVar8);
      pCVar8 = pCVar8 + 1;
    }
    ppCVar6 = ppCVar6 + 1;
    iVar3 = iVar3 + 0x1000;
  }
  return;
}

Assistant:

void CVmObjTable::save(VMG_ CVmFile *fp)
{
    CVmObjPageEntry **pg;
    CVmObjPageEntry *entry;
    size_t i;
    size_t j;
    vm_obj_id_t id;
    size_t toc_cnt;
    size_t save_cnt;
    long toc_cnt_pos;
    long end_pos;

    /*
     *   Before we save, perform a full GC pass.  This will ensure that we
     *   have removed all objects that are referenced only weakly, and
     *   cleaned up the weak references to them; this is important because
     *   we don't trace weak references for the purposes of calculating the
     *   set of objects that must be saved, and hence won't save any objects
     *   that are only weakly referenced, which would leave dangling
     *   references in the saved state if those weak references weren't
     *   cleaned up before the objects containing them are saved. 
     */
    gc_full(vmg0_);

    /* 
     *   Make sure that all of the metaclasses that we are actually using
     *   are in the metaclass dependency table.  We store the table in the
     *   file, because the table provides the mapping from file-local
     *   metaclass ID's to actual metaclasses; we must make sure that the
     *   table is complete (i.e., contains an entry for each metaclass of
     *   which there is an instance) before storing the table. 
     */
    add_metadeps_for_instances(vmg0_);

    /* save the metaclass table */
    G_meta_table->write_to_file(fp);

    /* 
     *   Figure out what objects we need to save.  We only need to save
     *   objects that are directly reachable from the root object set, from
     *   the imports, or from the globals.
     *   
     *   We don't need to save objects that are only accessible from the
     *   undo, because we don't save any undo information in the file.  We
     *   also don't need to save any objects that are reachable only from
     *   the stack, since the stack is inherently transient.
     *   
     *   Note that we don't need to trace from transient objects, since we
     *   won't be saving the transient objects and thus won't need to save
     *   anything referenced only from transient objects.
     *   
     *   So, we merely trace objects reachable from the imports, globals,
     *   and work queue.  At any time between GC passes, the work queue
     *   contains the complete list of root-set objects, hence we can simply
     *   trace from the current work queue.  
     */
    gc_trace_imports(vmg0_);
    gc_trace_globals(vmg0_);
    gc_trace_work_queue(vmg_ FALSE);

    /*
     *   Before we save the objects themselves, save a table of contents of
     *   the dynamically-allocated objects to be saved.  This table of
     *   contents will allow us to fix up references to objects on reloading
     *   the file with the new object numbers we assign them at that time.
     *   First, write a placeholder for the table of contents entry count.
     *   
     *   Note that we must store the table of contents in ascending order of
     *   object ID.  This happens naturally, since we scan the table in
     *   order of object ID.  
     */
    toc_cnt = 0;
    save_cnt = 0;
    toc_cnt_pos = fp->get_pos();
    fp->write_uint4(0);

    /* now scan the object pages and save the table of contents */
    for (id = 0, i = pages_used_, pg = pages_ ; i > 0 ; ++pg, --i)
    {
        /* scan all objects on this page */
        for (j = VM_OBJ_PAGE_CNT, entry = *pg ; j > 0 ; -- j, ++entry, ++id)
        {
            /* 
             *   If the entry is currently reachable, and it was dynamically
             *   allocated (which means it's not in the root set), then add
             *   it to the table of contents.  Note that we won't
             *   necessarily be saving the object, because the object could
             *   be transient - but if so, then we still want the record of
             *   the transient object, so we'll know on reloading that the
             *   object is no longer available.  
             */
            if (!entry->free_
                && entry->reachable_ == VMOBJ_REACHABLE
                && !entry->in_root_set_)
            {
                ulong flags;
                
                /* set up the flags */
                flags = 0;
                if (entry->transient_)
                    flags |= VMOBJ_TOC_TRANSIENT;

                /* write the object ID and flags */
                fp->write_uint4(id);
                fp->write_uint4(flags);

                /* count it */
                ++toc_cnt;
            }

            /* if it's saveable, count it among the saveable objects */
            if (entry->is_saveable())
                ++save_cnt;
        }
    }

    /* go back and fix up the size prefix for the table of contents */
    end_pos = fp->get_pos();
    fp->set_pos(toc_cnt_pos);
    fp->write_uint4(toc_cnt);
    fp->set_pos(end_pos);

    /* write the saveable object count, which we calculated above */
    fp->write_uint4(save_cnt);

    /* scan all object pages, and save each reachable object */
    for (id = 0, i = pages_used_, pg = pages_ ; i > 0 ; ++pg, --i)
    {
        /* scan all objects on this page */
        for (j = VM_OBJ_PAGE_CNT, entry = *pg ; j > 0 ; -- j, ++entry, ++id)
        {
            /* if this object is saveable, save it */
            if (entry->is_saveable())
            {
                uint idx;
                char buf[2];
                
                /* write the object ID */
                fp->write_uint4(id);

                /* store the root-set flag */
                buf[0] = (entry->in_root_set_ != 0);

                /* store the dependency table index */
                idx = entry->get_vm_obj()->
                      get_metaclass_reg()->get_reg_idx();
                buf[1] = (char)G_meta_table->get_dependency_index(idx);

                /* write the data */
                fp->write_bytes(buf, 2);

                /* save the metaclass-specific state */
                entry->get_vm_obj()->save_to_file(vmg_ fp);
            }
            
            /* 
             *   restore this object to the appropriate conditions in
             *   preparation for the next GC pass, so that we leave things
             *   as we found them -- saving the VM's state thus has no
             *   effect on the VM's state 
             */
            gc_set_init_conditions(id, entry);
        }
    }
}